

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Cues::PreloadCuePoint(Cues *this,long *cue_points_size,longlong pos)

{
  CuePoint **ppCVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  CuePoint **ppCVar5;
  CuePoint *this_00;
  CuePoint *local_98;
  ulong local_88;
  CuePoint *pCP;
  CuePoint **pp;
  CuePoint **p;
  CuePoint **q;
  CuePoint **qq;
  long n;
  longlong pos_local;
  long *cue_points_size_local;
  Cues *this_local;
  
  if (this->m_count == 0) {
    if (*cue_points_size <= this->m_preload_count) {
      if (*cue_points_size < 1) {
        local_88 = 0x800;
      }
      else {
        local_88 = *cue_points_size << 1;
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_88;
      uVar4 = SUB168(auVar3 * ZEXT816(8),0);
      if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      ppCVar5 = (CuePoint **)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
      if (ppCVar5 == (CuePoint **)0x0) {
        return false;
      }
      ppCVar1 = this->m_cue_points;
      lVar2 = this->m_preload_count;
      pp = ppCVar1;
      p = ppCVar5;
      while (pp != ppCVar1 + lVar2) {
        *p = *pp;
        pp = pp + 1;
        p = p + 1;
      }
      if (this->m_cue_points != (CuePoint **)0x0) {
        operator_delete__(this->m_cue_points);
      }
      this->m_cue_points = ppCVar5;
      *cue_points_size = local_88;
    }
    this_00 = (CuePoint *)operator_new(0x30,(nothrow_t *)&std::nothrow);
    local_98 = (CuePoint *)0x0;
    if (this_00 != (CuePoint *)0x0) {
      CuePoint::CuePoint(this_00,this->m_preload_count,pos);
      local_98 = this_00;
    }
    if (local_98 == (CuePoint *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      lVar2 = this->m_preload_count;
      this->m_preload_count = lVar2 + 1;
      this->m_cue_points[lVar2] = local_98;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Cues::PreloadCuePoint(long& cue_points_size, long long pos) const {
  if (m_count != 0)
    return false;

  if (m_preload_count >= cue_points_size) {
    const long n = (cue_points_size <= 0) ? 2048 : 2 * cue_points_size;

    CuePoint** const qq = new (std::nothrow) CuePoint*[n];
    if (qq == NULL)
      return false;

    CuePoint** q = qq;  // beginning of target

    CuePoint** p = m_cue_points;  // beginning of source
    CuePoint** const pp = p + m_preload_count;  // end of source

    while (p != pp)
      *q++ = *p++;

    delete[] m_cue_points;

    m_cue_points = qq;
    cue_points_size = n;
  }

  CuePoint* const pCP = new (std::nothrow) CuePoint(m_preload_count, pos);
  if (pCP == NULL)
    return false;

  m_cue_points[m_preload_count++] = pCP;
  return true;
}